

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall Image::save(Image *this,string *file_name)

{
  ostream *poVar1;
  pointer puVar2;
  size_t local_230;
  size_t j;
  ostream local_218 [8];
  ofstream out;
  string *file_name_local;
  Image *this_local;
  
  std::ofstream::ofstream(local_218,(string *)file_name,_S_bin);
  poVar1 = std::operator<<(local_218,"P6 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->width);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->height);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xff);
  std::operator<<(poVar1,"\n");
  for (local_230 = this->height; local_230 != 0; local_230 = local_230 - 1) {
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->data);
    std::ostream::write((char *)local_218,(long)(puVar2 + this->width * 3 * (local_230 - 1)));
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void save(const std::string& file_name) {
        std::ofstream out(file_name, std::ofstream::binary);
        out << "P6 " << width << " " << height << " " << 255 << "\n";
        for (size_t j = height; j > 0; --j)
            out.write(reinterpret_cast<char*>(data.get() + (j - 1) * 3 * width), sizeof(uint8_t) * 3 * width);
    }